

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O2

int __thiscall
MemoryProfiler::CreateArenaUsageSummary
          (MemoryProfiler *this,ArenaAllocator *alloc,bool liveOnly,LPWSTR **name_ptr,
          ArenaMemoryDataSummary ***summaries_ptr)

{
  uint uVar1;
  int iVar2;
  undefined4 *puVar3;
  Type pSVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  char16_t **ppcVar8;
  ArenaMemoryDataSummary **ppAVar9;
  ArenaMemoryDataSummary *__src;
  ArenaMemoryDataSummary *arenaMemoryDataSummary;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ArenaMemoryData *memoryData;
  size_t count;
  ulong uVar14;
  undefined8 *in_FS_OFFSET;
  
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                       ,0x12a,"(alloc)","alloc");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar3 = 0;
  }
  uVar7 = (this->arenaDataMap).count - (this->arenaDataMap).freeCount;
  count = (size_t)(int)uVar7;
  iVar11 = 0;
  ppcVar8 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t*,false>
                      ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,count);
  *name_ptr = ppcVar8;
  uVar1 = (this->arenaDataMap).bucketCount;
  for (uVar10 = 0; uVar10 != uVar1; uVar10 = uVar10 + 1) {
    iVar12 = (this->arenaDataMap).buckets[uVar10];
    if (iVar12 != -1) {
      while (iVar12 != -1) {
        pSVar4 = (this->arenaDataMap).entries;
        iVar2 = pSVar4[iVar12].
                super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
                super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
                .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.next;
        lVar13 = (long)iVar11;
        iVar11 = iVar11 + 1;
        ppcVar8[lVar13] =
             pSVar4[iVar12].
             super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
             super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
             .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.key;
        iVar12 = iVar2;
      }
    }
  }
  JsUtil::
  QuickSort<Memory::_no_write_barrier_policy,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp:311:42)>
  ::Sort(*name_ptr,count);
  uVar14 = 0;
  ppAVar9 = Memory::AllocateArray<Memory::ArenaAllocator,ArenaMemoryDataSummary*,false>
                      ((Memory *)alloc,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,count);
  *summaries_ptr = ppAVar9;
  uVar10 = 0;
  if (0 < (int)uVar7) {
    uVar10 = (ulong)uVar7;
  }
  do {
    if (uVar14 == uVar10) {
      return uVar7;
    }
    __src = JsUtil::
            BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->arenaDataMap,*name_ptr + uVar14);
    memoryData = __src->data;
    if (liveOnly) {
      if (memoryData != (ArenaMemoryData *)0x0) {
        arenaMemoryDataSummary =
             (ArenaMemoryDataSummary *)new<Memory::ArenaAllocator>(0xd8,alloc,0x2e5e08);
        goto LAB_002e4c7f;
      }
      arenaMemoryDataSummary = (ArenaMemoryDataSummary *)0x0;
    }
    else {
      arenaMemoryDataSummary =
           (ArenaMemoryDataSummary *)new<Memory::ArenaAllocator>(0xd8,alloc,0x1e925c);
      memcpy(arenaMemoryDataSummary,__src,0xd8);
LAB_002e4c7f:
      for (; memoryData != (ArenaMemoryData *)0x0; memoryData = memoryData->next) {
        arenaMemoryDataSummary->outstandingCount = arenaMemoryDataSummary->outstandingCount + 1;
        AccumulateData(arenaMemoryDataSummary,memoryData,false);
      }
      if (liveOnly) {
        arenaMemoryDataSummary->arenaCount = arenaMemoryDataSummary->outstandingCount;
      }
    }
    (*summaries_ptr)[uVar14] = arenaMemoryDataSummary;
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

int MemoryProfiler::CreateArenaUsageSummary(ArenaAllocator * alloc, bool liveOnly,
    _Outptr_result_buffer_(return) LPWSTR ** name_ptr, _Outptr_result_buffer_(return) ArenaMemoryDataSummary *** summaries_ptr)
{
    Assert(alloc);

    LPWSTR *& name = *name_ptr;
    ArenaMemoryDataSummary **& summaries = *summaries_ptr;

    int count = arenaDataMap.Count();
    name = AnewArray(alloc, LPWSTR, count);
    int i = 0;
    arenaDataMap.Map([&i, name](LPWSTR key, ArenaMemoryDataSummary*)
    {
        name[i++] = key;
    });

    qsort_s(name, count, sizeof(LPWSTR), [](void*, const void* a, const void* b) { return DefaultComparer<LPWSTR>::Compare(*(LPWSTR*)a, *(LPWSTR*)b); }, nullptr);

    summaries = AnewArray(alloc, ArenaMemoryDataSummary *, count);

    for (int j = 0; j < count; j++)
    {
        ArenaMemoryDataSummary * summary = arenaDataMap.Item(name[j]);
        ArenaMemoryData * data = summary->data;

        ArenaMemoryDataSummary * localSummary;
        if (liveOnly)
        {
            if (data == nullptr)
            {
                summaries[j] = nullptr;
                continue;
            }
            localSummary = AnewStructZ(alloc, ArenaMemoryDataSummary);
        }
        else
        {
            localSummary = Anew(alloc, ArenaMemoryDataSummary, *summary);
        }

        while (data != nullptr)
        {
            localSummary->outstandingCount++;
            AccumulateData(localSummary, data);
            data = data->next;
        }

        if (liveOnly)
        {
            localSummary->arenaCount = localSummary->outstandingCount;
        }
        summaries[j] = localSummary;
    }

    return count;
}